

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::AddImageQuad
          (ImDrawList *this,ImTextureID user_texture_id,ImVec2 *a,ImVec2 *b,ImVec2 *c,ImVec2 *d,
          ImVec2 *uv_a,ImVec2 *uv_b,ImVec2 *uv_c,ImVec2 *uv_d,ImU32 col)

{
  value_type *ppvVar1;
  
  if (0xffffff < col) {
    if (((this->_TextureIdStack).Size == 0) ||
       (ppvVar1 = ImVector<void_*>::back(&this->_TextureIdStack), *ppvVar1 != user_texture_id)) {
      PushTextureID(this,user_texture_id);
      PrimReserve(this,6,4);
      PrimQuadUV(this,a,b,c,d,uv_a,uv_b,uv_c,uv_d,col);
      PopTextureID(this);
      return;
    }
    PrimReserve(this,6,4);
    PrimQuadUV(this,a,b,c,d,uv_a,uv_b,uv_c,uv_d,col);
  }
  return;
}

Assistant:

void ImDrawList::AddImageQuad(ImTextureID user_texture_id, const ImVec2& a, const ImVec2& b, const ImVec2& c, const ImVec2& d, const ImVec2& uv_a, const ImVec2& uv_b, const ImVec2& uv_c, const ImVec2& uv_d, ImU32 col)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    const bool push_texture_id = _TextureIdStack.empty() || user_texture_id != _TextureIdStack.back();
    if (push_texture_id)
        PushTextureID(user_texture_id);

    PrimReserve(6, 4);
    PrimQuadUV(a, b, c, d, uv_a, uv_b, uv_c, uv_d, col);

    if (push_texture_id)
        PopTextureID();
}